

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

void __thiscall w3Interp::Invoke(w3Interp *this,w3Function *function)

{
  pointer *ppwVar1;
  w3Code *pwVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  w3Tag wVar7;
  uint uVar8;
  w3InstructionEnum wVar9;
  pointer pwVar10;
  pointer pwVar11;
  pointer pwVar12;
  pointer pwVar13;
  pointer pwVar14;
  w3DecodedInstruction *pwVar15;
  w3DecodedInstruction *pwVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  w3Section *pwVar19;
  undefined7 uVar20;
  w3Interp *pwVar21;
  w3Interp *this_00;
  w3Tag *pwVar22;
  Value *pVVar23;
  pointer pwVar24;
  int iVar25;
  int32_t iVar26;
  ulong uVar27;
  Value VVar28;
  w3Stack *this_01;
  char *pcVar29;
  w3Module *module;
  size_t sVar30;
  pointer pwVar31;
  size_t sVar32;
  ulong uVar33;
  long lVar34;
  size_t sVar35;
  long lVar36;
  uint32_t uVar37;
  float fVar38;
  double dVar39;
  uint64_t uVar40;
  undefined1 auVar41 [16];
  uint8_t *cursor;
  w3StackValue ret;
  double local_158;
  undefined1 local_120 [24];
  w3Code *local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  w3Interp *local_d0;
  size_t local_c8;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  Value VStack_b0;
  undefined1 local_a8 [16];
  uint64_t local_98;
  w3Stack *local_90;
  w3Code *local_88;
  w3Interp *local_80;
  size_t local_78;
  long local_70;
  uint8_t *local_68;
  undefined1 local_60 [40];
  size_t local_38;
  
  uVar33 = function->function_type_index;
  module = this->module;
  pwVar10 = (module->function_types).
            super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_80 = this;
  if (uVar33 < (ulong)(((long)(module->function_types).
                              super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pwVar10 >> 4) *
                      -0x5555555555555555)) {
    pwVar2 = (module->code).super__Vector_base<w3Code,_std::allocator<w3Code>_>._M_impl.
             super__Vector_impl_data._M_start + function->function_index;
    pwVar11 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_start;
    pwVar12 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pwVar13 = *(pointer *)
               &pwVar10[uVar33].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl
    ;
    pwVar14 = pwVar10[uVar33].parameters.super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_68 = pwVar2->cursor;
    if (local_68 != (uint8_t *)0x0) {
      DecodeFunction(module,pwVar2,&local_68);
      pwVar2->cursor = (uint8_t *)0x0;
    }
    pwVar21 = local_80;
    local_70 = (long)(pwVar2->decoded_instructions).
                     super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pwVar2->decoded_instructions).
                     super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (local_70 != 0) {
      sVar35 = (long)pwVar12 - (long)pwVar11;
      sVar32 = (long)pwVar14 - (long)pwVar13;
      local_90 = &local_80->super_w3Stack;
      w3Stack::DumpStack(local_90,"invoke1");
      this_00 = local_80;
      this_01 = local_90;
      local_c8 = 0;
      local_d0 = pwVar21;
      uVar5 = pwVar21->module;
      uVar6 = pwVar21->module_instance;
      local_120._16_4_ = (int)uVar5;
      local_120._8_8_ = uVar6;
      local_120._20_4_ = (int)((ulong)uVar5 >> 0x20);
      local_120._0_8_ = function->function_index;
      local_f0 = sVar32 + sVar35;
      if (pwVar12 == pwVar11) {
        local_e8 = (pointer)0x0;
      }
      else {
        local_e8 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      local_d8 = pwVar10 + uVar33;
      if (pwVar14 == pwVar13) {
        local_e0 = (pointer)0x0;
      }
      else {
        local_e0 = (local_d8->parameters).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      local_60[0] = Tag_Frame;
      local_60[8] = Tag_none;
      local_60._9_7_ = 0;
      local_60._16_8_ = (Value)0x0;
      local_60._24_16_ = (undefined1  [16])0x0;
      local_38 = 0;
      local_80->frame = (w3Frame *)local_120;
      local_108 = pwVar2;
      local_100 = sVar32;
      local_f8 = sVar35;
      local_88 = pwVar2;
      local_78 = local_f0;
      w3Stack::push_frame(local_90,(w3StackValue *)local_60);
      w3Stack::DumpStack(this_01,"pushed_frame");
      if (pwVar14 != pwVar13) {
        uVar33 = (long)pwVar13 * 0x30 + (long)pwVar14 * -0x30 | 8;
        sVar30 = 0;
        do {
          printf("2 entering function with param [%lX] type %X\n",sVar30,
                 (ulong)(&((this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                           super__Vector_impl_data._M_finish)->tag)[uVar33]);
          this_01 = local_90;
          sVar30 = sVar30 + 1;
          uVar33 = uVar33 + 0x30;
        } while (sVar32 != sVar30);
        if (pwVar14 != pwVar13) {
          lVar34 = sVar32 + (sVar32 == 0);
          lVar36 = -0x30;
          do {
            w3Stack::DumpStack(this_01,"moved_param_before");
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar22 = &pwVar24[-1].tag + lVar36;
            uVar17 = *(undefined8 *)pwVar22;
            wVar7 = ((TaggedValue *)(pwVar22 + 8))->tag;
            uVar20 = *(undefined7 *)&((TaggedValue *)(pwVar22 + 8))->field_0x1;
            auVar41 = *(undefined1 (*) [16])((long)pwVar24 + lVar36 + -0x20);
            puVar3 = (undefined8 *)((long)pwVar24 + lVar36 + -0x10);
            uVar18 = puVar3[1];
            puVar4 = (undefined8 *)((long)&(pwVar24->label).arity + lVar36);
            *puVar4 = *puVar3;
            puVar4[1] = uVar18;
            *(undefined1 (*) [16])((long)&(pwVar24->value).value + lVar36) = auVar41;
            pwVar22 = &pwVar24->tag + lVar36;
            *(undefined8 *)pwVar22 = uVar17;
            ((TaggedValue *)(pwVar22 + 8))->tag = wVar7;
            *(undefined7 *)&((TaggedValue *)(pwVar22 + 8))->field_0x1 = uVar20;
            w3Stack::DumpStack(this_01,"moved_param_after");
            lVar36 = lVar36 + -0x30;
            lVar34 = lVar34 + -1;
          } while (lVar34 != 0);
        }
      }
      (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
      super__Vector_impl_data._M_finish[-1 - sVar32].tag = Tag_Frame;
      w3Stack::DumpStack(this_01,"push_locals_before");
      pwVar2 = local_88;
      if (pwVar12 != pwVar11) {
        sVar32 = 0;
        do {
          wVar7 = (pwVar2->locals).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar32];
          local_a8 = (undefined1  [16])0x0;
          local_b8[0] = Tag_none;
          local_b8._1_7_ = 0;
          VStack_b0 = (Value)0x0;
          local_98 = 0;
          local_c0[0] = wVar7;
          if ((~wVar7 & 0x78) == 0) {
            local_c0[0] = Tag_Value;
            stack0xffffffffffffff49 = SUB1615((undefined1  [16])0x0,1);
            local_b8[0] = wVar7;
          }
          w3Stack::push_value(this_01,(w3StackValue *)local_c0);
          sVar32 = sVar32 + 1;
        } while (sVar35 != sVar32);
      }
      w3Stack::DumpStack(this_01,"push_locals_after");
      local_c8 = ((long)(this_00->stack->super_w3StackBase).super_w3StackBaseBase.
                        super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this_00->stack->super_w3StackBase).super_w3StackBaseBase.
                        super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - local_78;
      if (local_78 != 0) {
        lVar34 = 8;
        pwVar31 = (pointer)0x0;
        do {
          printf("2 entering function with local [%lX] type %X\n",pwVar31,
                 (ulong)(&(local_d0->stack->super_w3StackBase).super_w3StackBaseBase.
                          super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                          super__Vector_impl_data._M_start[local_c8].tag)[lVar34]);
          pwVar31 = pwVar31 + 1;
          lVar34 = lVar34 + 0x30;
        } while (pwVar12 + (long)(pwVar14 + (-(long)pwVar11 - (long)pwVar13)) != pwVar31);
      }
      pwVar15 = (this_00->super_Wasm).instr;
      module = (w3Module *)
               (local_88->decoded_instructions).
               super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this_00->super_Wasm).instr = (w3DecodedInstruction *)module;
      if (0 < local_70) {
        lVar34 = local_70 + -0x58;
        pwVar19 = module->sections;
        do {
          if (module == (w3Module *)0x0) {
            Invoke();
            goto LAB_0011995a;
          }
          switch(*(w3InstructionEnum *)&(module->name).field_2) {
          case Unreach:
            goto switchD_001171ca_caseD_0;
          case Nop:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nop",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            break;
          case Block:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Block",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_c0[0] = Tag_Label;
            local_b8[0] = Tag_none;
            local_b8._1_7_ = 0;
            VStack_b0 = (Value)0x0;
            pwVar16 = (this_00->super_Wasm).instr;
            local_a8 = ZEXT116((pwVar16->super_w3DecodedInstructionZeroInit).blockType != Tag_empty)
                       << 0x40;
            local_98 = (pwVar16->super_w3DecodedInstructionZeroInit).field_0.u64;
            w3Stack::push_label(this_01,(w3StackValue *)local_c0);
            break;
          case Loop:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Loop",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_c0[0] = Tag_Label;
            local_b8[0] = Tag_none;
            local_b8._1_7_ = 0;
            VStack_b0 = (Value)0x0;
            pwVar16 = (this_00->super_Wasm).instr;
            local_a8 = ZEXT116((pwVar16->super_w3DecodedInstructionZeroInit).blockType != Tag_empty)
                       << 0x40;
            local_98 = (pwVar16->super_w3DecodedInstructionZeroInit).field_0.u64;
            w3Stack::push_label(this_01,(w3StackValue *)local_c0);
            (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
            super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].label.arity = 0;
            break;
          case If:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","If",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            If(this_00);
            break;
          case Else:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Else",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            BlockEnd(this_00);
            (this_00->super_Wasm).instr =
                 (this_00->frame->code->decoded_instructions).
                 super__Vector_base<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 ((((this_00->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.
                  field_8.if_end - 1);
            break;
          case Reserved06:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved06";
            goto LAB_00119808;
          case Reserved07:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved07";
            goto LAB_00119808;
          case Reserved08:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved08";
            goto LAB_00119808;
          case Reserved09:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved09";
            goto LAB_00119808;
          case Reserved0A:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved0A";
            goto LAB_00119808;
          case BlockEnd:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","BlockEnd",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            BlockEnd(this_00);
            break;
          case Br:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Br",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Br(this_00);
            break;
          case BrIf:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","BrIf",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            BrIf(this_00);
            break;
          case BrTable:
switchD_001171ca_caseD_e:
            Invoke((w3Interp *)module);
            fprintf(_stderr,"AssertFailed:%s\n","!\"unreach\"");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jaykrell[P]w3/w3.cpp"
                          ,0x3d,"void AssertFailed(PCSTR)");
          case Ret:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ret",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ret(this_00);
            break;
          case Call:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Call",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Call(this_00);
            break;
          case Calli:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Calli",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Calli(this_00);
            break;
          case Reserved12:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved12";
            goto LAB_00119808;
          case Reserved13:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved13";
            goto LAB_00119808;
          case Reserved14:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved14";
            goto LAB_00119808;
          case Reserved15:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved15";
            goto LAB_00119808;
          case Reserved16:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved16";
            goto LAB_00119808;
          case Reserved17:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved17";
            goto LAB_00119808;
          case Reserved18:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved18";
            goto LAB_00119808;
          case Reserved19:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved19";
            goto LAB_00119808;
          case Drop:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Drop",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            goto LAB_001197e6;
          case Select:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Select",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Select(this_00);
            break;
          case Reserved1C:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved1C";
            goto LAB_00119808;
          case Reserved1D:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved1D";
            goto LAB_00119808;
          case Reserved1E:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved1E";
            goto LAB_00119808;
          case Reserved1F:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved1F";
            goto LAB_00119808;
          case Local_get:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_get",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Local_get(this_00);
            break;
          case Local_set:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_set",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Local_tee(this_00);
LAB_001197e6:
            w3Stack::AssertTopIsValue(this_01);
            ppwVar1 = &(this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                       super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppwVar1 = *ppwVar1 + -1;
            break;
          case Local_tee:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Local_tee",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Local_tee(this_00);
            break;
          case Global_get:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Global_get",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Global_get(this_00);
            break;
          case Global_set:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Global_set",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Global_set(this_00);
            break;
          case Reserved25:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved25";
            goto LAB_00119808;
          case Reserved26:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved26";
            goto LAB_00119808;
          case Reserved27:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "Reserved27";
            goto LAB_00119808;
          case i32_Load_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i32_Load_(this_00);
            break;
          case i64_Load_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i64_Load_(this_00);
            break;
          case f32_Load_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Load_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            f32_Load_(this_00);
            break;
          case f64_Load_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Load_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            f64_Load_(this_00);
            break;
          case i32_Load8s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load8s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i32_Load8s(this_00);
            break;
          case i32_Load8u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load8u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i32_Load8u(this_00);
            break;
          case i32_Load16s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load16s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i32_Load16s(this_00);
            break;
          case i32_Load16u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Load16u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i32_Load16u(this_00);
            break;
          case i64_Load8s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load8s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i64_Load8s(this_00);
            break;
          case i64_Load8u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load8u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i64_Load8u(this_00);
            break;
          case i64_Load16s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load16s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Load16s(this_00);
            break;
          case i64_Load16u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load16u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Load16u(this_00);
            break;
          case i64_Load32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load32s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Load32s(this_00);
            break;
          case i64_Load32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Load32u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Load32u(this_00);
            break;
          case i32_Store_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i32_Store_(this_00);
            break;
          case i64_Store_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i64_Store_(this_00);
            break;
          case f32_Store_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Store_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            f32_Store_(this_00);
            break;
          case f64_Store_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Store_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            f64_Store_(this_00);
            break;
          case i32_Store8:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store8",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i32_Store8(this_00);
            break;
          case i32_Store16:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Store16",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i32_Store16(this_00);
            break;
          case i64_Store8:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store8",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            i64_Store8(this_00);
            break;
          case i64_Store16:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store16",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Store16(this_00);
            break;
          case i64_Store32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Store32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            i64_Store32(this_00);
            break;
          case MemSize:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","MemSize",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_a8 = (undefined1  [16])0x0;
            stack0xffffffffffffff49 = SUB1615((undefined1  [16])0x0,1);
            local_b8[0] = Tag_i32;
            VStack_b0.i32 =
                 (int)((ulong)((long)(this_00->module_instance->memory).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->module_instance->memory).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 0x10);
            VStack_b0.u64._4_4_ = 0;
            goto LAB_001195da;
          case MemGrow:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","MemGrow",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            MemGrow(this_00);
            break;
          case i32_Const:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Const",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_a8 = (undefined1  [16])0x0;
            stack0xffffffffffffff49 = SUB1615((undefined1  [16])0x0,1);
            local_b8[0] = Tag_i32;
            VStack_b0.i32 =
                 (((this_00->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
            VStack_b0.u64._4_4_ = 0;
            goto LAB_001195da;
          case i64_Const:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Const",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_a8 = (undefined1  [16])0x0;
            stack0xffffffffffffff49 = SUB1615((undefined1  [16])0x0,1);
            local_b8[0] = Tag_i64;
            VStack_b0.u64 = ((Value *)(this_00->super_Wasm).instr)->u64;
            goto LAB_001195da;
          case f32_Const:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Const",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_a8 = ZEXT816(0);
            stack0xffffffffffffff49 = ZEXT715(0);
            local_b8[0] = Tag_f32;
            VStack_b0.i32 =
                 (((this_00->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
            VStack_b0.u64._4_4_ = 0;
            goto LAB_001195da;
          case f64_Const:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Const",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            local_a8 = ZEXT816(0);
            stack0xffffffffffffff49 = ZEXT715(0);
            local_b8[0] = Tag_f64;
            VStack_b0.u64 = ((Value *)(this_00->super_Wasm).instr)->u64;
LAB_001195da:
            local_98 = 0;
            local_c0[0] = Tag_Value;
            w3Stack::push_value(this_01,(w3StackValue *)local_c0);
            break;
          case Eqz_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eqz_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eqz_i32(this_00);
            break;
          case Eq_i32_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_i32_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eq_i32_(this_00);
            break;
          case Ne_i32_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_i32_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ne_i32_(this_00);
            break;
          case Lt_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i32s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_i32s(this_00);
            break;
          case Lt_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i32u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_i32u(this_00);
            break;
          case Gt_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i32s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_i32s(this_00);
            break;
          case Gt_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i32u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_i32u(this_00);
            break;
          case Le_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i32s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_i32s(this_00);
            break;
          case Le_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i32u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_i32u(this_00);
            break;
          case Ge_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i32s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_i32s(this_00);
            break;
          case Ge_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i32u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_i32u(this_00);
            break;
          case Eqz_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eqz_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eqz_i64(this_00);
            break;
          case Eq_i64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_i64_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eq_i64_(this_00);
            break;
          case Ne_i64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_i64_",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ne_i64_(this_00);
            break;
          case Lt_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i64s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_i64s(this_00);
            break;
          case Lt_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_i64u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_i64u(this_00);
            break;
          case Gt_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i64s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_i64s(this_00);
            break;
          case Gt_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_i64u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_i64u(this_00);
            break;
          case Le_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i64s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_i64s(this_00);
            break;
          case Le_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_i64u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_i64u(this_00);
            break;
          case Ge_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i64s",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_i64s(this_00);
            break;
          case Ge_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_i64u",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_i64u(this_00);
            break;
          case Eq_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eq_f32(this_00);
            break;
          case Ne_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ne_f32(this_00);
            break;
          case Lt_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_f32(this_00);
            break;
          case Gt_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_f32(this_00);
            break;
          case Le_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_f32(this_00);
            break;
          case Ge_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_f32(this_00);
            break;
          case Eq_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Eq_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Eq_f64(this_00);
            break;
          case Ne_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ne_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ne_f64(this_00);
            break;
          case Lt_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Lt_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Lt_f64(this_00);
            break;
          case Gt_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Gt_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Gt_f64(this_00);
            break;
          case Le_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Le_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Le_f64(this_00);
            break;
          case Ge_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ge_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Ge_f64(this_00);
            break;
          case CountLeadingZeros_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            iVar26 = 0;
            printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i32",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            iVar25 = pVVar23->i32;
            if (-1 < iVar25) {
              iVar26 = 0;
              do {
                iVar26 = iVar26 + 1;
                iVar25 = iVar25 * 2;
              } while (-1 < iVar25);
            }
            pVVar23->i32 = iVar26;
            break;
          case CountTrailingZeros_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i32",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            CountTrailingZeros_i32(this_00);
            break;
          case CountSetBits_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i32",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            CountSetBits_i32(this_00);
            break;
          case Add_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Add_i32(this_00);
            break;
          case Sub_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Sub_i32(this_00);
            break;
          case Mul_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Mul_i32(this_00);
            break;
          case Div_s_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_s_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_s_i32(this_00);
            break;
          case Div_u_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_u_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_u_i32(this_00);
            break;
          case Rem_s_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_s_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rem_s_i32(this_00);
            break;
          case Rem_u_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_u_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rem_u_i32(this_00);
            break;
          case And_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","And_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            And_i32(this_00);
            break;
          case Or_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Or_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Or_i32(this_00);
            break;
          case Xor_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Xor_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Xor_i32(this_00);
            break;
          case Shl_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shl_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shl_i32(this_00);
            break;
          case Shr_s_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_s_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shr_s_i32(this_00);
            break;
          case Shr_u_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_u_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shr_u_i32(this_00);
            break;
          case Rotl_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotl_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rotl_i32(this_00);
            break;
          case Rotr_i32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotr_i32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rotr_i32(this_00);
            break;
          case CountLeadingZeros_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            VVar28.u64 = 0;
            printf("interp%s x:%X u:%u i:%i\n","CountLeadingZeros_i64",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            lVar36 = pVVar23->i64;
            if (-1 < lVar36) {
              do {
                VVar28.i32 = VVar28.i32 + 1;
                VVar28.u64._4_4_ = 0;
                lVar36 = lVar36 * 2;
              } while (-1 < lVar36);
              VVar28.u64._4_4_ = 0;
            }
            *pVVar23 = VVar28;
            break;
          case CountTrailingZeros_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountTrailingZeros_i64",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            CountTrailingZeros_i64(this_00);
            break;
          case CountSetBits_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","CountSetBits_i64",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            CountSetBits_i64(this_00);
            break;
          case Add_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Add_i64(this_00);
            break;
          case Sub_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Sub_i64(this_00);
            break;
          case Mul_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Mul_i64(this_00);
            break;
          case Div_s_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_s_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_s_i64(this_00);
            break;
          case Div_u_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_u_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_u_i64(this_00);
            break;
          case Rem_s_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_s_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rem_s_i64(this_00);
            break;
          case Rem_u_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rem_u_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rem_u_i64(this_00);
            break;
          case And_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","And_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            And_i64(this_00);
            break;
          case Or_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Or_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Or_i64(this_00);
            break;
          case Xor_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Xor_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Xor_i64(this_00);
            break;
          case Shl_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shl_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shl_i64(this_00);
            break;
          case Shr_s_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_s_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shr_s_i64(this_00);
            break;
          case Shr_u_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Shr_u_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Shr_u_i64(this_00);
            break;
          case Rotl_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotl_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rotl_i64(this_00);
            break;
          case Rotr_i64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Rotr_i64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Rotr_i64(this_00);
            break;
          case Abs_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Abs_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            uVar37 = pVVar23->u32 & (uint)DAT_00125980;
            goto LAB_00118c4c;
          case Neg_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Neg_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            uVar37 = pVVar23->u32 ^ (uint)DAT_00125490;
LAB_00118c4c:
            pVVar23->u32 = uVar37;
            break;
          case Ceil_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ceil_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            fVar38 = ceilf(pVVar23->f32);
            goto LAB_001198c0;
          case Floor_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Floor_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            fVar38 = wasm_floorf(pVVar23->f32);
            goto LAB_001198c0;
          case Trunc_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Trunc_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            fVar38 = wasm_truncf(pVVar23->f32);
            goto LAB_001198c0;
          case Nearest_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nearest_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            fVar38 = wasm_roundf(pVVar23->f32);
            goto LAB_001198c0;
          case Sqrt_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sqrt_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            fVar38 = pVVar23->f32;
            if (fVar38 < 0.0) {
              fVar38 = sqrtf(fVar38);
            }
            else {
              fVar38 = SQRT(fVar38);
            }
LAB_001198c0:
            pVVar23->f32 = fVar38;
            break;
          case Add_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Add_f32(this_00);
            break;
          case Sub_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Sub_f32(this_00);
            break;
          case Mul_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Mul_f32(this_00);
            break;
          case Div_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_f32(this_00);
            break;
          case Min_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Min_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Min_f32(this_00);
            break;
          case Max_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Max_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Max_f32(this_00);
            break;
          case Copysign_f32:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Copysign_f32",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8
                  );
            Copysign_f32(this_00);
            break;
          case Abs_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Abs_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            uVar40 = pVVar23->u64 & (ulong)DAT_00125970;
            goto LAB_00118fec;
          case Neg_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Neg_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            uVar40 = pVVar23->u64 ^ (ulong)DAT_00125470;
LAB_00118fec:
            pVVar23->u64 = uVar40;
            break;
          case Ceil_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Ceil_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            dVar39 = ceil(pVVar23->f64);
            goto LAB_001198cc;
          case Floor_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Floor_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            dVar39 = floor(pVVar23->f64);
            goto LAB_001198cc;
          case Trunc_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Trunc_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            dVar39 = wasm_truncd(pVVar23->f64);
            goto LAB_001198cc;
          case Nearest_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Nearest_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8)
            ;
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            dVar39 = wasm_roundd(pVVar23->f64);
            goto LAB_001198cc;
          case Sqrt_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sqrt_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            dVar39 = pVVar23->f64;
            if (dVar39 < 0.0) {
              dVar39 = sqrt(dVar39);
            }
            else {
              dVar39 = SQRT(dVar39);
            }
LAB_001198cc:
            pVVar23->f64 = dVar39;
            break;
          case Add_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Add_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Add_f64(this_00);
            break;
          case Sub_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Sub_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Sub_f64(this_00);
            break;
          case Mul_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Mul_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Mul_f64(this_00);
            break;
          case Div_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Div_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Div_f64(this_00);
            break;
          case Min_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Min_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Min_f64(this_00);
            break;
          case Max_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Max_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8);
            Max_f64(this_00);
            break;
          case Copysign_f64:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","Copysign_f64",(ulong)uVar8,(ulong)uVar8,(ulong)uVar8
                  );
            Copysign_f64(this_00);
            break;
          case i32_Wrap_i64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Wrap_i64_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            iVar26 = pVVar23->i32;
            goto LAB_00118e9d;
          case i32_Trunc_f32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            iVar26 = (int32_t)pVVar23->f32;
            goto LAB_00118e9d;
          case i32_Trunc_f32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f32u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            iVar26 = (int32_t)(long)pVVar23->f32;
            goto LAB_00118a8e;
          case i32_Trunc_f64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            iVar26 = (int32_t)pVVar23->f64;
LAB_00118e9d:
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_i32;
            pwVar24[-1].value.value.i32 = iVar26;
            break;
          case i32_Trunc_f64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Trunc_f64u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            iVar26 = (int32_t)(long)pVVar23->f64;
LAB_00118a8e:
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_i32;
            pwVar24[-1].value.value.i32 = iVar26;
            break;
          case i64_Extend_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            uVar33 = (ulong)pVVar23->i32;
            goto LAB_00118f9e;
          case i64_Extend_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Extend_i32u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            uVar33 = (ulong)pVVar23->u32;
            goto LAB_00118f9e;
          case i64_Trunc_f32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            uVar33 = (ulong)pVVar23->f32;
            goto LAB_00118f9e;
          case i64_Trunc_f32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f32u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            uVar33 = (ulong)pVVar23->f32;
            uVar27 = (ulong)(pVVar23->f32 - 9.223372e+18);
            goto LAB_00118f98;
          case i64_Trunc_f64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            uVar33 = (ulong)pVVar23->f64;
            goto LAB_00118f9e;
          case i64_Trunc_f64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Trunc_f64u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            uVar33 = (ulong)pVVar23->f64;
            uVar27 = (ulong)(pVVar23->f64 - 9.223372036854776e+18);
LAB_00118f98:
            uVar33 = uVar27 & (long)uVar33 >> 0x3f | uVar33;
LAB_00118f9e:
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_i64;
            pwVar24[-1].value.value.u64 = uVar33;
            break;
          case f32_Convert_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            uVar33 = (ulong)pVVar23->u32;
LAB_0011809e:
            fVar38 = (float)(long)uVar33;
            goto LAB_0011991e;
          case f32_Convert_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i32s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            fVar38 = (float)pVVar23->i32;
            goto LAB_0011991e;
          case f32_Convert_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            uVar33 = pVVar23->i64;
            if (-1 < (long)uVar33) goto LAB_0011809e;
            fVar38 = (float)uVar33;
            goto LAB_0011991e;
          case f32_Convert_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Convert_i64s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            fVar38 = (float)pVVar23->i64;
            goto LAB_0011991e;
          case f32_Demote_f64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Demote_f64_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f64);
            fVar38 = (float)pVVar23->f64;
LAB_0011991e:
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_f32;
            pwVar24[-1].value.value.f32 = fVar38;
            break;
          case f64_Convert_i32s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            local_158 = (double)pVVar23->i32;
            goto LAB_0011904e;
          case f64_Convert_i32u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i32u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i32);
            local_158 = (double)pVVar23->u32;
            goto LAB_0011904e;
          case f64_Convert_i64s:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64s",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            local_158 = (double)pVVar23->i64;
            goto LAB_0011904e;
          case f64_Convert_i64u:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Convert_i64u",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_i64);
            auVar41._0_8_ = (double)CONCAT44(0x43300000,(*pVVar23).i32);
            auVar41._8_4_ = (int)((ulong)*pVVar23 >> 0x20);
            auVar41._12_4_ = 0x45300000;
            local_158 = (auVar41._8_8_ - 1.9342813113834067e+25) +
                        (auVar41._0_8_ - 4503599627370496.0);
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_f64;
            goto LAB_00119068;
          case f64_Promote_f32_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Promote_f32_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pVVar23 = w3Stack::value(this_01,Tag_f32);
            local_158 = (double)pVVar23->f32;
LAB_0011904e:
            w3Stack::AssertTopIsValue(this_01);
            pwVar24 = (this_00->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
                      super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pwVar24[-1].value.tag = Tag_f64;
LAB_00119068:
            pwVar24[-1].value.value.f64 = local_158;
            break;
          case i32_Reinterpret_f32_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i32_Reinterpret_f32_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pwVar22 = w3Stack::tag(this_01,Tag_f32);
            *pwVar22 = Tag_i32;
            break;
          case i64_Reinterpret_f64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","i64_Reinterpret_f64_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pwVar22 = w3Stack::tag(this_01,Tag_f64);
            *pwVar22 = Tag_i64;
            break;
          case f32_Reinterpret_i32_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f32_Reinterpret_i32_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pwVar22 = w3Stack::tag(this_01,Tag_i32);
            *pwVar22 = Tag_f32;
            break;
          case f64_Reinterpret_i64_:
            uVar8 = (((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32;
            printf("interp%s x:%X u:%u i:%i\n","f64_Reinterpret_i64_",(ulong)uVar8,(ulong)uVar8,
                   (ulong)uVar8);
            pwVar22 = w3Stack::tag(this_01,Tag_i64);
            *pwVar22 = Tag_f64;
            break;
          case ReservedC0:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC0";
            goto LAB_00119808;
          case ReservedC1:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC1";
            goto LAB_00119808;
          case ReservedC2:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC2";
            goto LAB_00119808;
          case ReservedC3:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC3";
            goto LAB_00119808;
          case ReservedC4:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC4";
            goto LAB_00119808;
          case ReservedC5:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC5";
            goto LAB_00119808;
          case ReservedC6:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC6";
            goto LAB_00119808;
          case ReservedC7:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC7";
            goto LAB_00119808;
          case ReservedC8:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC8";
            goto LAB_00119808;
          case ReservedC9:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedC9";
            goto LAB_00119808;
          case ReservedCA:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCA";
            goto LAB_00119808;
          case ReservedCB:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCB";
            goto LAB_00119808;
          case ReservedCC:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCC";
            goto LAB_00119808;
          case ReservedCD:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCD";
            goto LAB_00119808;
          case ReservedCE:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCE";
            goto LAB_00119808;
          case ReservedCF:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedCF";
            goto LAB_00119808;
          case ReservedD0:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD0";
            goto LAB_00119808;
          case ReservedD1:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD1";
            goto LAB_00119808;
          case ReservedD2:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD2";
            goto LAB_00119808;
          case ReservedD3:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD3";
            goto LAB_00119808;
          case ReservedD4:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD4";
            goto LAB_00119808;
          case ReservedD5:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD5";
            goto LAB_00119808;
          case ReservedD6:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD6";
            goto LAB_00119808;
          case ReservedD7:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD7";
            goto LAB_00119808;
          case ReservedD8:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD8";
            goto LAB_00119808;
          case ReservedD9:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedD9";
            goto LAB_00119808;
          case ReservedDA:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDA";
            goto LAB_00119808;
          case ReservedDB:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDB";
            goto LAB_00119808;
          case ReservedDC:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDC";
            goto LAB_00119808;
          case ReservedDD:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDD";
            goto LAB_00119808;
          case ReservedDE:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDE";
            goto LAB_00119808;
          case ReservedDF:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedDF";
            goto LAB_00119808;
          case ReservedE0:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE0";
            goto LAB_00119808;
          case ReservedE1:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE1";
            goto LAB_00119808;
          case ReservedE2:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE2";
            goto LAB_00119808;
          case ReservedE3:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE3";
            goto LAB_00119808;
          case ReservedE4:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE4";
            goto LAB_00119808;
          case ReservedE5:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE5";
            goto LAB_00119808;
          case ReservedE6:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE6";
            goto LAB_00119808;
          case ReservedE7:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE7";
            goto LAB_00119808;
          case ReservedE8:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE8";
            goto LAB_00119808;
          case ReservedE9:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedE9";
            goto LAB_00119808;
          case ReservedEA:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedEA";
            goto LAB_00119808;
          case ReservedEB:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedEB";
            goto LAB_00119808;
          case ReservedEC:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedEC";
            goto LAB_00119808;
          case ReservedED:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedED";
            goto LAB_00119808;
          case ReservedEE:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedEE";
            goto LAB_00119808;
          case ReservedEF:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedEF";
            goto LAB_00119808;
          case ReservedF0:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF0";
            goto LAB_00119808;
          case ReservedF1:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF1";
            goto LAB_00119808;
          case ReservedF2:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF2";
            goto LAB_00119808;
          case ReservedF3:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF3";
            goto LAB_00119808;
          case ReservedF4:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF4";
            goto LAB_00119808;
          case ReservedF5:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF5";
            goto LAB_00119808;
          case ReservedF6:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF6";
            goto LAB_00119808;
          case ReservedF7:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF7";
            goto LAB_00119808;
          case ReservedF8:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF8";
            goto LAB_00119808;
          case ReservedF9:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedF9";
            goto LAB_00119808;
          case ReservedFA:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFA";
            goto LAB_00119808;
          case ReservedFB:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFB";
            goto LAB_00119808;
          case ReservedFC:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFC";
            goto LAB_00119808;
          case ReservedFD:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFD";
            goto LAB_00119808;
          case ReservedFE:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFE";
            goto LAB_00119808;
          case ReservedFF:
            uVar33 = (ulong)(((w3DecodedInstructionZeroInit *)&module->_vptr_w3Module)->field_0).u32
            ;
            pcVar29 = "ReservedFF";
LAB_00119808:
            printf("interp%s x:%X u:%u i:%i\n",pcVar29,uVar33,uVar33,uVar33);
            (*(this_00->super_Wasm)._vptr_Wasm[2])(this_00);
            (*(this_00->super_Wasm)._vptr_Wasm[2])(this_00);
          }
          pwVar16 = (this_00->super_Wasm).instr;
          wVar9 = (pwVar16->super_w3DecodedInstructionZeroInit).name;
          if (wVar9 - Call < 2) {
            this_00->frame = (w3Frame *)local_120;
          }
          else if (wVar9 == Ret) break;
          module = (w3Module *)(pwVar16 + 1);
          (this_00->super_Wasm).instr = (w3DecodedInstruction *)module;
        } while (module < (w3Module *)((long)pwVar19 + lVar34));
      }
      (this_00->super_Wasm).instr = pwVar15;
      return;
    }
  }
  else {
LAB_0011995a:
    Invoke();
  }
  Invoke();
switchD_001171ca_caseD_0:
  Invoke((w3Interp *)module);
  goto switchD_001171ca_caseD_e;
}

Assistant:

void w3Interp::Invoke (w3Function& function)
{
    //__debugbreak ();
    // Decode function upon first call.
    // TODO thread safety
    // TODO merge with calli (invoke)

    const size_t function_type_index = function.function_type_index;
    Assert (function_type_index < module->function_types.size ());
    w3FunctionType* function_type = &module->function_types [function_type_index];
    w3Code* code = &module->code [function.function_index];
    const size_t local_only_count = code->locals.size ();
    const size_t param_count = function_type->parameters.size ();

    uint8_t* cursor = code->cursor;
    if (cursor)
    {
        DecodeFunction (module, code, &cursor);
        code->cursor = 0;
    }
    const size_t size = code->decoded_instructions.size ();
    Assert (size);

    DumpStack ("invoke1");

    // TODO cross-module calls
    // TODO calling embedding
    // setup frame
    w3Frame frame_value;
    frame_value.interp = this;
    frame_value.code = code;
    frame_value.module = this->module; // TODO cross module calls
    frame_value.module_instance = this->module_instance; // TODO cross module calls
    frame_value.function_index = function.function_index;
    frame_value.param_count = param_count;
    frame_value.param_and_local_count = local_only_count + param_count; // TODO overflow
    frame_value.local_only_count = local_only_count;
    frame_value.local_only_types = local_only_count ? &code->locals [0] : 0;
    frame_value.param_types = param_count ? &function_type->parameters [0] : 0;
    frame_value.function_type = function_type;

    w3StackValue ret (frame);
    this->frame = &frame_value;
    push_frame (ret);
    DumpStack ("pushed_frame");

    size_t i = 0;
    size_t j = 0;

    for (j = 0; j != param_count; ++j)
    {
        printf ("2 entering function with param [%" FORMAT_SIZE "X] type %X\n", j, (end () - (ssize_t)param_count + (ssize_t)j)->value.tag);
    }

    // CONSIDER put the interp loop elsewhere
    // Invoke would adjust member data and return to it

    // params are subsumed into new frame

    // TODO We really want this to be more efficient.
    // Either by having split stacks, or by computing
    // maximum parameter count and putting return before it.

    // For now live with memcpy or slower (stack is not presently contiguous)..

    if (param_count)
    {
        for (i = 0; i < param_count; ++i)
        {
            DumpStack ("moved_param_before");
            *(end () - 1 - (ssize_t)i) = *(end () - 2 - (ssize_t)i);
            DumpStack ("moved_param_after");
        }
    }

    // place return frame/address (frame is just a marker now, the data is on the native stack)

    (end () - 1 - (ssize_t)param_count)->tag = Tag_Frame;
    //(end () - 1 - param_count)->frame = frame;
    //(end () - 1 - param_count)->instr = instr + !!instr;

    // Push locals on stack.
    // TODO params also
    // TODO reserve (size () + local_only_count);
    DumpStack ("push_locals_before");
    for (i = 0; i != local_only_count; ++i)
        push_value (w3StackValue (code->locals [i]));

    DumpStack ("push_locals_after");
    // Provide for indexing locals.
    frame_value.locals = stack.size () - local_only_count - param_count;

    for (j = 0; j != local_only_count + param_count; ++j)
        printf ("2 entering function with local [%" FORMAT_SIZE "X] type %X\n", j, frame_value.Local (j).value.tag);

    //DumpStack ("invoke2");

    // TODO provide for separate depth -- i.e. here is now 0; locals/params cannot be popped

    w3DecodedInstruction* previous = instr; // call/ret handling
    instr = &code->decoded_instructions [0];
    w3DecodedInstruction* end = instr + size;
    for (; instr < end; ++instr) // Br subtracts one so this works.
    {
        Assert (instr);
        switch (instr->name)
        {
            // break before instead of after to avoid unreachable code warning
#undef RESERVED
#define RESERVED(b0) INSTRUCTION (0x ## b0, 0, 0, Reserved ## b0, Imm_none, 0, 0, Tag_none, Tag_none, Tag_none, Tag_none) { Reserved (); }

#undef INSTRUCTION
#define INSTRUCTION(byte0, fixed_size, byte1, name, imm, pop, push, in0, in1, in2, out0)     \
            break;                                                                           \
            case ::name:                                                                   \
            printf ("interp%s x:%X u:%u i:%i\n", #name, instr->u32, instr->u32, instr->u32); \
            this->name ();
#include "w3Instructions.h"
        }
        // special handling
        if (instr->name == ::Ret) // gross but most choices are
            break;
#include "diag-switch-push.h"
        switch (instr->name)
        {
        case ::Call:
        case ::Calli:
            frame = &frame_value; // TODO should handled in Ret.
            break;
        }
#include "diag-switch-pop.h"
    }
    instr = previous;
    // TODO handle ret
    //__debugbreak ();
}